

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tp_tcp.c
# Opt level: O0

void latency_tcp_main(void)

{
  int iVar1;
  int64_t iVar2;
  tcp_connection *conn_00;
  request *prVar3;
  ssize_t sVar4;
  application_protocol *paVar5;
  int64_t iVar6;
  long lVar7;
  byte_req_pair bVar8;
  uint64_t local_130;
  char local_128 [8];
  char hostname_2 [64];
  char hostname_1 [64];
  char hostname [64];
  byte_req_pair send_res;
  byte_req_pair read_res;
  request *to_send;
  tcp_connection *conn;
  long next_tx;
  long end_time;
  long start_time;
  int bytes_to_send;
  int ret;
  int i;
  
  iVar1 = latency_open_connections();
  if (iVar1 != 0) {
    exit(-1);
  }
  conn = (tcp_connection *)time_ns();
  while( true ) {
    do {
      while (iVar1 = should_load(), iVar1 == 0) {
        conn = (tcp_connection *)time_ns();
      }
      iVar2 = time_ns();
    } while ((iVar2 < (long)conn) || (conn_00 = pick_conn(), conn_00 == (tcp_connection *)0x0));
    prVar3 = prepare_request();
    start_time._4_4_ = 0;
    for (bytes_to_send = 0; bytes_to_send < prVar3->iov_cnt; bytes_to_send = bytes_to_send + 1) {
      start_time._4_4_ = start_time._4_4_ + (int)prVar3->iovs[bytes_to_send].iov_len;
    }
    iVar2 = time_ns();
    sVar4 = writev(conn_00->fd,(iovec *)prVar3->iovs,prVar3->iov_cnt);
    iVar1 = (int)sVar4;
    if (iVar1 < 0) {
      gethostname(hostname_1 + 0x38,0x40);
      fprintf(_stderr,"[%s] ",hostname_1 + 0x38);
      perror("Writev failed\n");
      return;
    }
    if (iVar1 != start_time._4_4_) {
      __assert_fail("ret == bytes_to_send",
                    "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_tcp.c"
                    ,0x178,"void latency_tcp_main(void)");
    }
    bVar8.reqs = 1;
    bVar8.bytes = (long)iVar1;
    add_throughput_tx_sample(bVar8);
    if (conn_00->buffer_idx != 0) break;
    do {
      if ((int)(0x4000 - (uint)conn_00->buffer_idx) < 1) {
        __assert_fail("MAX_PAYLOAD - conn->buffer_idx > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_tcp.c"
                      ,0x180,"void latency_tcp_main(void)");
      }
      sVar4 = recv(conn_00->fd,conn_00->buffer + conn_00->buffer_idx,
                   (long)(int)(0x4000 - (uint)conn_00->buffer_idx),0);
      if ((int)sVar4 < 0) {
        gethostname(hostname_2 + 0x38,0x40);
        fprintf(_stderr,"[%s] ",hostname_2 + 0x38);
        perror("Error read\n");
        return;
      }
      if ((int)sVar4 == 0) {
        close(conn_00->fd);
        gethostname(local_128,0x40);
        fprintf(_stderr,"[%s] ",local_128);
        fprintf(_stderr,"Connection closed\n");
        conn_00->closed = 1;
      }
      else {
        conn_00->buffer_idx = conn_00->buffer_idx + (short)sVar4;
        bVar8 = handle_response(conn_00);
        local_130 = bVar8.reqs;
        if (local_130 != 0) {
          paVar5 = get_app_proto();
          if ((paVar5->type == PROTO_MEMCACHED_BIN) && (local_130 != 1)) {
            __assert_fail("read_res.reqs == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_tcp.c"
                          ,0x191,"void latency_tcp_main(void)");
          }
          iVar6 = time_ns();
          add_throughput_rx_sample(bVar8);
          add_latency_sample(iVar6 - iVar2,(timespec *)0x0);
          lVar7 = get_ia();
          conn = (tcp_connection *)(conn->buffer + lVar7 + -0xc);
        }
      }
    } while (conn_00->buffer_idx != 0);
  }
  __assert_fail("conn->buffer_idx == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/tp_tcp.c"
                ,0x17e,"void latency_tcp_main(void)");
}

Assistant:

static void latency_tcp_main(void)
{
	int i, ret, bytes_to_send;
	long start_time, end_time, next_tx;
	struct tcp_connection *conn;
	struct request *to_send;
	struct byte_req_pair read_res;
	struct byte_req_pair send_res;

	if (latency_open_connections())
		exit(-1);

	next_tx = time_ns();
	while (1) {
		if (!should_load()) {
			next_tx = time_ns();
			continue;
		}
		if (time_ns() < next_tx)
			continue;
		conn = pick_conn();
		if (!conn)
			continue;

		to_send = prepare_request();
		bytes_to_send = 0;
		for (i = 0; i < to_send->iov_cnt; i++)
			bytes_to_send += to_send->iovs[i].iov_len;

		start_time = time_ns();
		ret = writev(conn->fd, to_send->iovs, to_send->iov_cnt);
		if (ret < 0) {
			lancet_perror("Writev failed\n");
			return;
		}
		assert(ret == bytes_to_send);
		/* Bookkeeping */
		send_res.bytes = ret;
		send_res.reqs = 1;
		add_throughput_tx_sample(send_res);

		assert(conn->buffer_idx == 0);
		do {
			assert(MAX_PAYLOAD - conn->buffer_idx > 0);
			ret = recv(conn->fd, &conn->buffer[conn->buffer_idx], MAX_PAYLOAD - conn->buffer_idx, 0);
			if (ret < 0) {
				lancet_perror("Error read\n");
				return;
			}
			if (ret == 0) {
				close(conn->fd);
				lancet_fprintf(stderr, "Connection closed\n");
				conn->closed = 1;
				continue;
			}

			conn->buffer_idx += ret;
			read_res = handle_response(conn);
			if (read_res.reqs > 0) {
                                if (get_app_proto()->type == PROTO_MEMCACHED_BIN) {
                                        assert(read_res.reqs == 1);
                                }
				end_time = time_ns();
				/*BookKeeping*/
				add_throughput_rx_sample(read_res);
				add_latency_sample((end_time - start_time), NULL);

				/*Schedule next*/
				next_tx += get_ia();
			}
		} while (conn->buffer_idx);
	}
}